

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O3

uc_afl_ret
uc_afl_fuzz_custom(uc_engine *uc,char *input_file,uc_afl_cb_place_input_t place_input_callback,
                  uc_afl_fuzz_cb_t fuzz_callbck,uc_afl_cb_validate_crash_t validate_crash_callback,
                  bool always_validate,uint32_t persistent_iters,void *data)

{
  uc_afl_ret uVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  UCAFL local_e0;
  
  log_init();
  if ((((uc == (uc_engine *)0x0) || (input_file == (char *)0x0)) || (*input_file == '\0')) ||
     (((place_input_callback == (uc_afl_cb_place_input_t)0x0 ||
       (always_validate && validate_crash_callback == (uc_afl_cb_validate_crash_t)0x0)) ||
      (fuzz_callbck == (uc_afl_fuzz_cb_t)0x0)))) {
    log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    uVar1 = UC_AFL_RET_ERROR;
  }
  else {
    local_e0.persistent_iters_ = persistent_iters;
    local_e0.data_ = data;
    local_e0.afl_area_ptr_ = (uint8_t *)0x0;
    local_e0.has_afl_ = false;
    local_e0.afl_prev_loc_ = 0;
    local_e0.afl_testcase_ptr_ = (uint32_t *)0x0;
    local_e0.afl_testcase_len_p_ = (uint32_t *)0x0;
    local_e0.afl_child_pipe_[0] = 0;
    local_e0.afl_child_pipe_[1] = 0;
    local_e0.afl_parent_pipe_[0] = 0;
    local_e0.afl_parent_pipe_[1] = 0;
    local_e0.h1_ = 0;
    local_e0.h2_ = 0;
    local_e0.h3_ = 0;
    local_e0.h4_ = 0;
    local_e0.uc_ = uc;
    local_e0.input_file_ = input_file;
    local_e0.place_input_callback_ = place_input_callback;
    local_e0.validate_crash_callback_ = validate_crash_callback;
    local_e0.fuzz_callback_ = fuzz_callbck;
    local_e0.always_validate_ = always_validate;
    uVar1 = UCAFL::fsrv_run(&local_e0);
    UCAFL::~UCAFL(&local_e0);
  }
  return uVar1;
}

Assistant:

UNICORNAFL_EXPORT uc_afl_ret uc_afl_fuzz_custom(
    uc_engine* uc, char* input_file,
    uc_afl_cb_place_input_t place_input_callback, uc_afl_fuzz_cb_t fuzz_callbck,
    uc_afl_cb_validate_crash_t validate_crash_callback, bool always_validate,
    uint32_t persistent_iters, void* data) {

    log_init();

    if (!uc) {
        ERR("Unicorn Engine passed to uc_afl_fuzz is NULL!\n");
        return UC_AFL_RET_ERROR;
    }
    if (!input_file || input_file[0] == 0) {
        ERR("No input file provided to uc_afl_fuzz.\n");
        return UC_AFL_RET_ERROR;
    }
    if (!place_input_callback) {
        ERR("no place_input_callback set.\n");
        return UC_AFL_RET_ERROR;
    }
    if (always_validate && !validate_crash_callback) {
        ERR("always_validate set but validate_crash_callback is missing.\n");
        return UC_AFL_RET_ERROR;
    }
    if (!fuzz_callbck) {
        ERR("No fuzz_callback set.\n");
        return UC_AFL_RET_ERROR;
    }

    UCAFL ucafl(uc, input_file, place_input_callback, validate_crash_callback,
                fuzz_callbck, always_validate, persistent_iters, data);

    return ucafl.fsrv_run();
}